

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O2

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  int iVar2;
  void *returnvalue;
  void *returnvalue_00;
  long lVar3;
  long lVar4;
  int iVar5;
  
  lVar4 = *user_data;
  returnvalue = (void *)N_VGetArrayPointer();
  iVar2 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar5 = 1;
  if (iVar2 == 0) {
    returnvalue_00 = (void *)N_VGetArrayPointer(ydot);
    iVar2 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar2 == 0) {
      iVar5 = 0;
      if (lVar4 < 1) {
        lVar4 = 0;
      }
      for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
        dVar1 = *(double *)((long)returnvalue + lVar3 * 8);
        *(double *)((long)returnvalue_00 + lVar3 * 8) = dVar1 * dVar1 * (1.0 - dVar1);
      }
    }
  }
  return iVar5;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunindextype i;

  /* access state array data */
  Y = N_VGetArrayPointer(y);
  if (check_retval((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  /* access RHS array data */
  Ydot = N_VGetArrayPointer(ydot);
  if (check_retval((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing reaction term */
  for (i = 0; i < N; i++) { Ydot[i] = Y[i] * Y[i] * (SUN_RCONST(1.0) - Y[i]); }

  /* Return with success */
  return 0;
}